

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

int parse_args_DEFB(Context *ctx)

{
  parse_destination_token(ctx,&ctx->dest_arg);
  if ((ctx->dest_arg).regtype != REG_TYPE_CONSTBOOL) {
    failf(ctx,"%s","DEFB using non-CONSTBOOL register");
  }
  if ((ctx->dest_arg).relative != 0) {
    failf(ctx,"%s","relative addressing in DEFB");
  }
  ctx->dwords[0] = (uint)(*ctx->tokens != 0);
  return 3;
}

Assistant:

static int parse_args_DEFB(Context *ctx)
{
    parse_destination_token(ctx, &ctx->dest_arg);
    if (ctx->dest_arg.regtype != REG_TYPE_CONSTBOOL)
        fail(ctx, "DEFB using non-CONSTBOOL register");
    if (ctx->dest_arg.relative)  // I'm pretty sure this is illegal...?
        fail(ctx, "relative addressing in DEFB");

    ctx->dwords[0] = *(ctx->tokens) ? 1 : 0;

    return 3;
}